

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZParFrontMatrix.cpp
# Opt level: O0

void __thiscall
TPZParFrontMatrix<double,_TPZStackEqnStorage<double>,_TPZFrontSym<double>_>::AddKel
          (TPZParFrontMatrix<double,_TPZStackEqnStorage<double>,_TPZFrontSym<double>_> *this,
          TPZFMatrix<double> *elmat,TPZVec<long> *destinationindex)

{
  DecomposeType DVar1;
  void *mineq_00;
  int64_t iVar2;
  TPZParFrontMatrix<double,_TPZStackEqnStorage<double>,_TPZFrontSym<double>_> *this_00;
  TPZBaseMatrix *in_RDI;
  lock_guard<std::mutex> lock;
  TPZEqnArray<double> *AuxEqn;
  int64_t maxeq;
  int64_t mineq;
  mutex_type *in_stack_ffffffffffffff88;
  lock_guard<std::mutex> *in_stack_ffffffffffffff90;
  TPZEqnArray<double> *in_stack_ffffffffffffff98;
  TPZFrontMatrix<double,_TPZStackEqnStorage<double>,_TPZFrontSym<double>_>
  *in_stack_ffffffffffffffa0;
  int64_t *in_stack_ffffffffffffffa8;
  TPZVec<long> *in_stack_ffffffffffffffb8;
  TPZFrontMatrix<double,_TPZStackEqnStorage<double>,_TPZFrontSym<double>_>
  *in_stack_ffffffffffffffc0;
  TPZFMatrix<double> *in_stack_ffffffffffffffc8;
  TPZFrontSym<double> *in_stack_ffffffffffffffd0;
  long local_28;
  long local_20;
  
  TPZFrontSym<double>::AddKel
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
             (TPZVec<long> *)in_stack_ffffffffffffffc0);
  TPZFrontMatrix<double,_TPZStackEqnStorage<double>,_TPZFrontSym<double>_>::EquationsToDecompose
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,(int64_t *)in_RDI,
             in_stack_ffffffffffffffa8);
  if (local_20 <= local_28) {
    mineq_00 = operator_new(0x3290);
    TPZEqnArray<double>::TPZEqnArray((TPZEqnArray<double> *)in_stack_ffffffffffffffc0);
    TPZFrontSym<double>::DecomposeEquations
              ((TPZFrontSym<double> *)in_RDI,(int64_t)mineq_00,(int64_t)in_stack_ffffffffffffffa0,
               in_stack_ffffffffffffff98);
    TPZFrontMatrix<double,_TPZStackEqnStorage<double>,_TPZFrontSym<double>_>::CheckCompress
              (in_stack_ffffffffffffffa0);
    std::lock_guard<std::mutex>::lock_guard(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    TPZStack<TPZEqnArray<double>_*,_10>::Push
              ((TPZStack<TPZEqnArray<double>_*,_10> *)in_stack_ffffffffffffffa0,
               in_stack_ffffffffffffff98);
    iVar2 = TPZBaseMatrix::Rows(in_RDI);
    if (local_28 == iVar2 + -1) {
      this_00 = (TPZParFrontMatrix<double,_TPZStackEqnStorage<double>,_TPZFrontSym<double>_> *)
                std::operator<<((ostream *)&std::cout,"Decomposition finished");
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
      std::ostream::flush();
      FinishWriting(this_00);
    }
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1d3af38);
    std::condition_variable::notify_all();
  }
  DVar1 = TPZFrontSym<double>::GetDecomposeType((TPZFrontSym<double> *)&in_RDI[0xfcf].fRow);
  in_RDI->fDecomposed = (char)DVar1;
  return;
}

Assistant:

void TPZParFrontMatrix<TVar, store, front>::AddKel(TPZFMatrix<TVar> & elmat, TPZVec < int64_t > & destinationindex)
{
	
	// message #1.3 to fFront:TPZFront
	this->fFront.AddKel(elmat, destinationindex);
#ifdef PZ_LOG
	{
		std::stringstream sout;
		sout << "Frondwidth after AddKel "<< this->fFront.FrontSize();
		LOGPZ_INFO(loggerfw,sout.str())
	}
#endif

	int64_t mineq, maxeq;
	this->EquationsToDecompose(destinationindex, mineq, maxeq);
	if(maxeq >= mineq) {

		TPZEqnArray<TVar> *AuxEqn = new TPZEqnArray<TVar>;
		
		this->fFront.DecomposeEquations(mineq,maxeq,*AuxEqn);
		this->CheckCompress();
        {
            std::lock_guard<std::mutex> lock(fwritelock);
            fEqnStack.Push(AuxEqn);
            if(maxeq == this->Rows()-1){
                cout << "Decomposition finished" << endl;
                cout.flush();
                FinishWriting();
                //fStorage.ReOpen();
            }
        }
        fwritecond.notify_all();
	}
	this->fDecomposed = this->fFront.GetDecomposeType();
}